

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int paranoid_fclose(FILE *fp)

{
  int iVar1;
  int *piVar2;
  FILE *fp_local;
  
  iVar1 = fflush((FILE *)fp);
  if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 9)) {
    fclose((FILE *)fp);
    fp_local._4_4_ = -1;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    iVar1 = fileno((FILE *)fp);
    iVar1 = fsync(iVar1);
    if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 0x16)) {
      fclose((FILE *)fp);
      fp_local._4_4_ = -1;
    }
    else {
      fp_local._4_4_ = fclose((FILE *)fp);
    }
  }
  return fp_local._4_4_;
}

Assistant:

int paranoid_fclose(FILE *fp) {
    if (-1 == fflush(fp) && errno != EBADF) {
	fclose(fp);
	return -1;
    }

    errno = 0;
    if (-1 == fsync(fileno(fp))) {
	if (errno != EINVAL) { // eg pipe
	    fclose(fp);
	    return -1;
	}
    }
    return fclose(fp);
}